

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeLhs(SPxLPBase<double> *this,int i,double *newLhs,bool scale)

{
  double *pdVar1;
  byte in_CL;
  double *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  double dVar2;
  int in_stack_ffffffffffffffbc;
  LPRowSetBase<double> *in_stack_ffffffffffffffc0;
  LPRowSetBase<double> *this_00;
  
  if (((in_CL & 1) != 0) && (dVar2 = *in_RDX, pdVar1 = (double *)infinity(), -*pdVar1 < dVar2)) {
    dVar2 = (double)(**(code **)(**(long **)(in_RDI + 0x1a8) + 0x168))
                              (*in_RDX,*(long **)(in_RDI + 0x1a8),in_RDI,in_ESI);
    pdVar1 = LPRowSetBase<double>::lhs_w(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    *pdVar1 = dVar2;
    return;
  }
  this_00 = (LPRowSetBase<double> *)*in_RDX;
  pdVar1 = LPRowSetBase<double>::lhs_w(this_00,in_stack_ffffffffffffffbc);
  *pdVar1 = (double)this_00;
  return;
}

Assistant:

virtual void changeLhs(int i, const R& newLhs, bool scale = false)
   {
      if(scale && newLhs > R(-infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPRowSetBase<R>::lhs_w(i) = lp_scaler->scaleLhs(*this, i, newLhs);
      }
      else
         LPRowSetBase<R>::lhs_w(i) = newLhs;

      assert(isConsistent());
   }